

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,
               XrPassthroughMeshTransformInfoHTC *value,string *prefix,string *type_string,
               bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  string *prefix_00;
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  bool bVar2;
  XrInstance pXVar3;
  ostream *poVar4;
  invalid_argument *piVar5;
  ulong uVar6;
  XrGeneratedDispatchTable *pXVar7;
  XrVector3f *value_01;
  allocator local_9b9;
  long local_9b8;
  ulong local_9b0;
  string time_prefix;
  string pose_prefix;
  string basespace_prefix;
  string scale_prefix;
  string indices_prefix;
  string vertices_prefix;
  string type_prefix;
  string indexcount_prefix;
  string vertexcount_prefix;
  string next_prefix;
  undefined1 local_868 [32];
  string local_848;
  undefined1 local_828 [32];
  string local_808;
  string local_7e8;
  undefined1 local_7c8 [64];
  ostringstream oss_vertexCount;
  ostringstream oss_baseSpace;
  uint auStack_5f8 [88];
  ostringstream oss_indices_array;
  uint auStack_480 [88];
  ostringstream oss_vertices_array;
  uint auStack_308 [88];
  ostringstream oss_indexCount;
  
  PointerToHexString<XrPassthroughMeshTransformInfoHTC>(value);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_vertexCount);
  std::__cxx11::string::~string((string *)&oss_vertexCount);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_vertexCount,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_vertexCount
              );
    std::__cxx11::string::~string((string *)&oss_vertexCount);
  }
  else {
    _oss_vertexCount = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&oss_vertexCount);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (char (*) [64])&oss_vertexCount);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_7e8,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_7e8,contents);
  std::__cxx11::string::~string((string *)&local_7e8);
  if (!bVar2) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Invalid Operation");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::string((string *)&vertexcount_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&vertexcount_prefix);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_vertexCount);
  poVar4 = std::operator<<((ostream *)&oss_vertexCount,"0x");
  *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
       *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&vertexcount_prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &oss_vertices_array);
  std::__cxx11::string::~string((string *)&oss_vertices_array);
  std::__cxx11::string::string((string *)&vertices_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&vertices_prefix);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_vertices_array);
  *(uint *)((long)auStack_308 + *(long *)(_oss_vertices_array + -0x18)) =
       *(uint *)((long)auStack_308 + *(long *)(_oss_vertices_array + -0x18)) & 0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(&oss_vertices_array);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[18],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [18])"const XrVector3f*",&vertices_prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_indexCount);
  std::__cxx11::string::~string((string *)&oss_indexCount);
  local_9b8 = 0;
  prefix_00 = (string *)(local_7c8 + 0x20);
  for (local_9b0 = 0; local_9b0 < value->vertexCount; local_9b0 = local_9b0 + 1) {
    std::__cxx11::string::string((string *)&oss_indexCount,(string *)&vertices_prefix);
    std::__cxx11::string::append((char *)&oss_indexCount);
    std::__cxx11::to_string((string *)&oss_indices_array,(uint)local_9b0);
    std::__cxx11::string::append((string *)&oss_indexCount);
    std::__cxx11::string::~string((string *)&oss_indices_array);
    std::__cxx11::string::append((char *)&oss_indexCount);
    value_01 = (XrVector3f *)((long)&value->vertices->x + local_9b8);
    std::__cxx11::string::string((string *)prefix_00,(string *)&oss_indexCount);
    pXVar7 = (XrGeneratedDispatchTable *)local_7c8;
    std::__cxx11::string::string
              ((string *)local_7c8,"const XrVector3f*",(allocator *)&oss_indices_array);
    bVar2 = ApiDumpOutputXrStruct(pXVar7,value_01,prefix_00,(string *)local_7c8,false,contents);
    std::__cxx11::string::~string((string *)local_7c8);
    std::__cxx11::string::~string((string *)prefix_00);
    if (!bVar2) {
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar5,"Invalid Operation");
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::__cxx11::string::~string((string *)&oss_indexCount);
    local_9b8 = local_9b8 + 0xc;
  }
  std::__cxx11::string::string((string *)&indexcount_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&indexcount_prefix);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_indexCount);
  poVar4 = std::operator<<((ostream *)&oss_indexCount,"0x");
  *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
       *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&indexcount_prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_indices_array
            );
  std::__cxx11::string::~string((string *)&oss_indices_array);
  std::__cxx11::string::string((string *)&indices_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&indices_prefix);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_indices_array);
  *(uint *)((long)auStack_480 + *(long *)(_oss_indices_array + -0x18)) =
       *(uint *)((long)auStack_480 + *(long *)(_oss_indices_array + -0x18)) & 0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(&oss_indices_array);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [16])"const uint32_t*",&indices_prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_baseSpace);
  std::__cxx11::string::~string((string *)&oss_baseSpace);
  for (uVar6 = 0; uVar6 < value->indexCount; uVar6 = uVar6 + 1) {
    std::__cxx11::string::string((string *)&basespace_prefix,(string *)&indices_prefix);
    std::__cxx11::string::append((char *)&basespace_prefix);
    std::__cxx11::to_string((string *)&oss_baseSpace,(uint)uVar6);
    std::__cxx11::string::append((string *)&basespace_prefix);
    std::__cxx11::string::~string((string *)&oss_baseSpace);
    std::__cxx11::string::append((char *)&basespace_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_baseSpace);
    poVar4 = std::operator<<((ostream *)&oss_baseSpace,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"const uint32_t*",&basespace_prefix,&time_prefix);
    std::__cxx11::string::~string((string *)&time_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_baseSpace);
    std::__cxx11::string::~string((string *)&basespace_prefix);
  }
  std::__cxx11::string::string((string *)&basespace_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&basespace_prefix);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_baseSpace);
  *(uint *)((long)auStack_5f8 + *(long *)(_oss_baseSpace + -0x18)) =
       *(uint *)((long)auStack_5f8 + *(long *)(_oss_baseSpace + -0x18)) & 0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(&oss_baseSpace);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[8],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [8])"XrSpace",&basespace_prefix,&time_prefix);
  std::__cxx11::string::~string((string *)&time_prefix);
  std::__cxx11::string::string((string *)&time_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&time_prefix);
  std::__cxx11::to_string(&pose_prefix,value->time);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [7])"XrTime",&time_prefix,&pose_prefix);
  std::__cxx11::string::~string((string *)&pose_prefix);
  std::__cxx11::string::string((string *)&pose_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&pose_prefix);
  std::__cxx11::string::string((string *)(local_828 + 0x20),(string *)&pose_prefix);
  pXVar7 = (XrGeneratedDispatchTable *)local_828;
  std::__cxx11::string::string((string *)pXVar7,"XrPosef",(allocator *)&scale_prefix);
  bVar2 = ApiDumpOutputXrStruct
                    (pXVar7,&value->pose,(string *)(local_828 + 0x20),(string *)local_828,false,
                     contents);
  std::__cxx11::string::~string((string *)local_828);
  std::__cxx11::string::~string((string *)(local_828 + 0x20));
  if (bVar2) {
    std::__cxx11::string::string((string *)&scale_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&scale_prefix);
    std::__cxx11::string::string((string *)(local_868 + 0x20),(string *)&scale_prefix);
    pXVar7 = (XrGeneratedDispatchTable *)local_868;
    std::__cxx11::string::string((string *)pXVar7,"XrVector3f",&local_9b9);
    bVar2 = ApiDumpOutputXrStruct
                      (pXVar7,&value->scale,(string *)(local_868 + 0x20),(string *)local_868,false,
                       contents);
    std::__cxx11::string::~string((string *)local_868);
    std::__cxx11::string::~string((string *)(local_868 + 0x20));
    if (bVar2) {
      std::__cxx11::string::~string((string *)&scale_prefix);
      std::__cxx11::string::~string((string *)&pose_prefix);
      std::__cxx11::string::~string((string *)&time_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_baseSpace);
      std::__cxx11::string::~string((string *)&basespace_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_indices_array);
      std::__cxx11::string::~string((string *)&indices_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_indexCount);
      std::__cxx11::string::~string((string *)&indexcount_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_vertices_array);
      std::__cxx11::string::~string((string *)&vertices_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_vertexCount);
      std::__cxx11::string::~string((string *)&vertexcount_prefix);
      std::__cxx11::string::~string((string *)&next_prefix);
      std::__cxx11::string::~string((string *)&type_prefix);
      return true;
    }
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Invalid Operation");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar5,"Invalid Operation");
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrPassthroughMeshTransformInfoHTC* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string vertexcount_prefix = prefix;
        vertexcount_prefix += "vertexCount";
        std::ostringstream oss_vertexCount;
        oss_vertexCount << "0x" << std::hex << (value->vertexCount);
        contents.emplace_back("uint32_t", vertexcount_prefix, oss_vertexCount.str());
        std::string vertices_prefix = prefix;
        vertices_prefix += "vertices";
        std::ostringstream oss_vertices_array;
        oss_vertices_array << std::hex << reinterpret_cast<const void*>(value->vertices);
        contents.emplace_back("const XrVector3f*", vertices_prefix, oss_vertices_array.str());
        for (uint32_t value_vertices_inc = 0; value_vertices_inc < value->vertexCount; ++value_vertices_inc) {
            std::string vertices_array_prefix = vertices_prefix;
            vertices_array_prefix += "[";
            vertices_array_prefix += std::to_string(value_vertices_inc);
            vertices_array_prefix += "]";
            if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->vertices[value_vertices_inc], vertices_array_prefix, "const XrVector3f*", false, contents)) {
                throw std::invalid_argument("Invalid Operation");
            }
        }
        std::string indexcount_prefix = prefix;
        indexcount_prefix += "indexCount";
        std::ostringstream oss_indexCount;
        oss_indexCount << "0x" << std::hex << (value->indexCount);
        contents.emplace_back("uint32_t", indexcount_prefix, oss_indexCount.str());
        std::string indices_prefix = prefix;
        indices_prefix += "indices";
        std::ostringstream oss_indices_array;
        oss_indices_array << std::hex << (value->indices);
        contents.emplace_back("const uint32_t*", indices_prefix, oss_indices_array.str());
        for (uint32_t value_indices_inc = 0; value_indices_inc < value->indexCount; ++value_indices_inc) {
            std::string indices_array_prefix = indices_prefix;
            indices_array_prefix += "[";
            indices_array_prefix += std::to_string(value_indices_inc);
            indices_array_prefix += "]";
            std::ostringstream oss_indices;
            oss_indices << "0x" << std::hex << (value->indices[value_indices_inc]);
            contents.emplace_back("const uint32_t*", indices_array_prefix, oss_indices.str());
        }
        std::string basespace_prefix = prefix;
        basespace_prefix += "baseSpace";
        std::ostringstream oss_baseSpace;
        oss_baseSpace << std::hex << reinterpret_cast<const void*>(value->baseSpace);
        contents.emplace_back("XrSpace", basespace_prefix, oss_baseSpace.str());
        std::string time_prefix = prefix;
        time_prefix += "time";
        contents.emplace_back("XrTime", time_prefix, std::to_string(value->time));
        std::string pose_prefix = prefix;
        pose_prefix += "pose";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->pose, pose_prefix, "XrPosef", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string scale_prefix = prefix;
        scale_prefix += "scale";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->scale, scale_prefix, "XrVector3f", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        return true;
    } catch(...) {
    }
    return false;
}